

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkCollectNewTfi2_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int fTravIdPrev;
  int *pFanins;
  int iFanin;
  int i;
  Vec_Int_t *vTfiNew_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  iVar2 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar2 == 0) {
    if ((iVar1 != 0) && (iVar1 = Acb_ObjIsCi(p,iObj), iVar1 == 0)) {
      pFanins._4_4_ = 0;
      piVar3 = Acb_ObjFanins(p,iObj);
      for (; pFanins._4_4_ < *piVar3; pFanins._4_4_ = pFanins._4_4_ + 1) {
        Acb_NtkCollectNewTfi2_rec(p,piVar3[pFanins._4_4_ + 1],vTfiNew);
      }
    }
    Vec_IntPush(vTfiNew,iObj);
  }
  return;
}

Assistant:

void Acb_NtkCollectNewTfi2_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    int fTravIdPrev = Acb_ObjIsTravIdPrev(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( fTravIdPrev && !Acb_ObjIsCi(p, iObj) )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
            Acb_NtkCollectNewTfi2_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}